

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O2

void __thiscall Sap_Apu::run_until(Sap_Apu *this,blip_time_t end_time)

{
  uchar *puVar1;
  int iVar2;
  Sap_Apu_Impl *this_00;
  Blip_Buffer *buf;
  long lVar3;
  int iVar4;
  uint uVar5;
  int t;
  byte bVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  byte bVar16;
  blip_time_t bVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  int local_98;
  int local_94;
  byte_ *local_58;
  
  calc_periods(this);
  this_00 = this->impl;
  bVar22 = -1 < (char)this->control;
  iVar7 = 0x1ff;
  if (bVar22) {
    iVar7 = 0x1ffff;
  }
  this->polym_pos = this->polym_pos % iVar7;
  for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
    iVar13 = this->last_time;
    iVar9 = this->oscs[lVar20].delay;
    iVar2 = this->oscs[lVar20].period;
    t = iVar9 + iVar13;
    buf = this->oscs[lVar20].output;
    if (buf != (Blip_Buffer *)0x0) {
      buf->modified_ = 1;
      bVar16 = this->oscs[lVar20].regs[1];
      uVar15 = (uint)bVar16 + (uint)bVar16 & 0x1e;
      bVar6 = (byte)((bVar16 & 0x10) >> 4);
      if ((uVar15 == 0 || bVar6 != 0) || (iVar2 < 0x4a && (~bVar16 & 0xa0) == 0)) {
        uVar15 = uVar15 >> (bVar6 ^ 1);
        iVar9 = uVar15 - this->oscs[lVar20].last_amp;
        if (iVar9 != 0) {
          this->oscs[lVar20].last_amp = uVar15;
          Blip_Synth<12,_1>::offset(&this_00->synth,iVar13,iVar9,buf);
        }
      }
      else {
        if ((this->control & (uint)"\x04\x02"[lVar20]) == 0) {
          local_98 = 0;
          iVar13 = end_time;
        }
        else {
          local_98 = this->oscs[lVar20 + 2].period;
          iVar13 = iVar13 + this->oscs[lVar20 + 2].delay;
          if (this->oscs[lVar20].invert != '\0') {
            piVar8 = &this->oscs[lVar20].last_amp;
            *piVar8 = *piVar8 - uVar15;
            uVar15 = -uVar15;
          }
        }
        if (iVar13 < end_time || t < end_time) {
          if ((bVar16 & 0x20) == 0) {
            bVar21 = (bVar16 & 0x40) == 0;
            uVar19 = 0x330;
            if (bVar21) {
              uVar19 = (ulong)bVar22 << 6 | 0x332;
            }
            piVar8 = &this->poly4_pos;
            iVar14 = 0xf;
            if (bVar21) {
              piVar8 = &this->polym_pos;
              iVar14 = iVar7;
            }
            local_58 = (byte_ *)((long)(this_00->synth).impulses + (uVar19 - 0x28));
            local_94 = iVar2 % iVar14;
            uVar19 = (long)(*piVar8 + iVar9) % (long)iVar14 & 0xffffffff;
          }
          else {
            uVar19 = (ulong)(this->oscs[lVar20].phase & 1);
            local_58 = "UU";
            iVar14 = 0x10;
            local_94 = 1;
          }
          if ((char)bVar16 < '\0') {
            bVar16 = 0;
            uVar12 = 0x167c6ea1;
          }
          else {
            bVar16 = (byte)((iVar9 + this->poly5_pos) % 0x1f);
            uVar12 = 0x167c6ea1U >> (~bVar16 & 0x1f) | 0x167c6ea1 << (bVar16 & 0x1f) & 0x7fffffffU;
            bVar16 = (byte)(iVar2 % 0x1f);
          }
          uVar11 = this->oscs[lVar20].last_amp;
          do {
            if (iVar13 < t) {
              uVar10 = (int)uVar15 >> 0x1f & uVar15;
              iVar9 = uVar10 - uVar11;
              if (iVar9 != 0) {
                uVar11 = uVar10 - uVar15;
                uVar15 = -uVar15;
                Blip_Synth<12,_1>::offset(&this_00->synth,iVar13,iVar9,buf);
              }
            }
            iVar4 = t + 1;
            iVar9 = iVar4;
            if (iVar4 < iVar13) {
              iVar9 = iVar13;
            }
            iVar13 = iVar13 + (((iVar9 - iVar13) - (uint)(iVar13 < iVar4)) /
                               (local_98 + (uint)(local_98 == 0)) + (uint)(iVar13 < iVar4)) *
                              local_98;
            bVar17 = end_time;
            if (iVar13 < end_time) {
              bVar17 = iVar13;
            }
            for (; t < bVar17; t = t + iVar2) {
              if ((uVar12 & 1) != 0) {
                uVar18 = (uint)uVar19;
                uVar10 = 0;
                if ((local_58[(int)uVar18 >> 3] >> (uVar18 & 7) & 1) != 0) {
                  uVar10 = uVar15;
                }
                uVar5 = (local_94 - iVar14) + uVar18;
                uVar18 = uVar18 + local_94;
                if (-1 < (int)uVar5) {
                  uVar18 = uVar5;
                }
                uVar19 = (ulong)uVar18;
                if (uVar10 - uVar11 != 0) {
                  Blip_Synth<12,_1>::offset(&this_00->synth,t,uVar10 - uVar11,buf);
                  uVar11 = uVar10;
                }
              }
              uVar12 = uVar12 >> (0x1f - bVar16 & 0x1f) | uVar12 << (bVar16 & 0x1f) & 0x7fffffff;
            }
          } while ((iVar13 < end_time) || (t < end_time));
          this->oscs[lVar20].phase = (uchar)uVar19;
          this->oscs[lVar20].last_amp = uVar11;
        }
        this->oscs[lVar20].invert = '\0';
        if ((int)uVar15 < 0) {
          piVar8 = &this->oscs[lVar20].last_amp;
          *piVar8 = *piVar8 - uVar15;
          this->oscs[lVar20].invert = '\x01';
        }
      }
    }
    if (end_time - t != 0 && t <= end_time) {
      lVar3 = (long)((end_time - t) + iVar2 + -1) / (long)iVar2;
      puVar1 = &this->oscs[lVar20].phase;
      *puVar1 = *puVar1 ^ (byte)lVar3;
      t = (int)lVar3 * iVar2 + t;
    }
    this->oscs[lVar20].delay = t - end_time;
  }
  iVar7 = end_time - this->last_time;
  this->last_time = end_time;
  this->poly4_pos = (this->poly4_pos + iVar7) % 0xf;
  this->poly5_pos = (this->poly5_pos + iVar7) % 0x1f;
  this->polym_pos = this->polym_pos + iVar7;
  return;
}

Assistant:

void Sap_Apu::run_until( blip_time_t end_time )
{
	calc_periods();
	Sap_Apu_Impl* const impl = this->impl; // cache
	
	// 17/9-bit poly selection
	byte const* polym = impl->poly17;
	int polym_len = poly17_len;
	if ( this->control & 0x80 )
	{
		polym_len = poly9_len;
		polym = impl->poly9;
	}
	polym_pos %= polym_len;
	
	for ( int i = 0; i < osc_count; i++ )
	{
		osc_t* const osc = &oscs [i];
		blip_time_t time = last_time + osc->delay;
		blip_time_t const period = osc->period;
		
		// output
		Blip_Buffer* output = osc->output;
		if ( output )
		{
			output->set_modified();
			
			int const osc_control = osc->regs [1]; // cache
			int volume = (osc_control & 0x0F) * 2;
			if ( !volume || osc_control & 0x10 || // silent, DAC mode, or inaudible frequency
					((osc_control & 0xA0) == 0xA0 && period < 1789773 / 2 / max_frequency) )
			{
				if ( !(osc_control & 0x10) )
					volume >>= 1; // inaudible frequency = half volume
				
				int delta = volume - osc->last_amp;
				if ( delta )
				{
					osc->last_amp = volume;
					impl->synth.offset( last_time, delta, output );
				}
				
				// TODO: doesn't maintain high pass flip-flop (very minor issue)
			}
			else
			{
				// high pass
				static byte const hipass_bits [osc_count] = { 1 << 2, 1 << 1, 0, 0 };
				blip_time_t period2 = 0; // unused if no high pass
				blip_time_t time2 = end_time;
				if ( this->control & hipass_bits [i] )
				{
					period2 = osc [2].period;
					time2 = last_time + osc [2].delay;
					if ( osc->invert )
					{
						// trick inner wave loop into inverting output
						osc->last_amp -= volume;
						volume = -volume;
					}
				}
				
				if ( time < end_time || time2 < end_time )
				{
					// poly source
					static byte const poly1 [] = { 0x55, 0x55 }; // square wave
					byte const* poly = poly1;
					int poly_len = 8 * sizeof poly1; // can be just 2 bits, but this is faster
					int poly_pos = osc->phase & 1;
					int poly_inc = 1;
					if ( !(osc_control & 0x20) )
					{
						poly     = polym;
						poly_len = polym_len;
						poly_pos = polym_pos;
						if ( osc_control & 0x40 )
						{
							poly     = impl->poly4;
							poly_len = poly4_len;
							poly_pos = poly4_pos;
						}
						poly_inc = period % poly_len;
						poly_pos = (poly_pos + osc->delay) % poly_len;
					}
					poly_inc -= poly_len; // allows more optimized inner loop below
					
					// square/poly5 wave
					blargg_ulong wave = poly5;
					check( poly5 & 1 ); // low bit is set for pure wave
					int poly5_inc = 0;
					if ( !(osc_control & 0x80) )
					{
						wave = run_poly5( wave, (osc->delay + poly5_pos) % poly5_len );
						poly5_inc = period % poly5_len;
					}
					
					// Run wave and high pass interleved with each catching up to the other.
					// Disabled high pass has no performance effect since inner wave loop
					// makes no compromise for high pass, and only runs once in that case.
					int osc_last_amp = osc->last_amp;
					do
					{
						// run high pass
						if ( time2 < time )
						{
							int delta = -osc_last_amp;
							if ( volume < 0 )
								delta += volume;
							if ( delta )
							{
								osc_last_amp += delta - volume;
								volume = -volume;
								impl->synth.offset( time2, delta, output );
							}
						}
						while ( time2 <= time ) // must advance *past* time to avoid hang
							time2 += period2;
						
						// run wave
						blip_time_t end = end_time;
						if ( end > time2 )
							end = time2;
						while ( time < end )
						{
							if ( wave & 1 )
							{
								int amp = volume & -(poly [poly_pos >> 3] >> (poly_pos & 7) & 1);
								if ( (poly_pos += poly_inc) < 0 )
									poly_pos += poly_len;
								int delta = amp - osc_last_amp;
								if ( delta )
								{
									osc_last_amp = amp;
									impl->synth.offset( time, delta, output );
								}
							}
							wave = run_poly5( wave, poly5_inc );
							time += period;
						}
					}
					while ( time < end_time || time2 < end_time );
					
					osc->phase = poly_pos;
					osc->last_amp = osc_last_amp;
				}
				
				osc->invert = 0;
				if ( volume < 0 )
				{
					// undo inversion trickery
					osc->last_amp -= volume;
					osc->invert = 1;
				}
			}
		}
		
		// maintain divider
		blip_time_t remain = end_time - time;
		if ( remain > 0 )
		{
			blargg_long count = (remain + period - 1) / period;
			osc->phase ^= count;
			time += count * period;
		}
		osc->delay = time - end_time;
	}
	
	// advance polies
	blip_time_t duration = end_time - last_time;
	last_time = end_time;
	poly4_pos = (poly4_pos + duration) % poly4_len;
	poly5_pos = (poly5_pos + duration) % poly5_len;
	polym_pos += duration; // will get %'d on next call
}